

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

int __thiscall TPZFMatrix<long>::Decompose_LU(TPZFMatrix<long> *this,TPZVec<int> *index)

{
  int *piVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  int extraout_var_10;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long aux;
  long local_70;
  long local_68;
  long local_60;
  TPZVec<int> *local_58;
  long local_50;
  long local_48;
  long local_40;
  undefined8 local_38;
  
  iVar4 = 0;
  if ((this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDecomposed == '\0') {
    lVar9 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
    if (lVar9 == (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol) {
      local_58 = index;
      (*index->_vptr_TPZVec[3])(index,lVar9);
      auVar2 = _DAT_014d28c0;
      if (0 < lVar9) {
        piVar1 = local_58->fStore;
        lVar7 = lVar9 + -1;
        auVar11._8_4_ = (int)lVar7;
        auVar11._0_8_ = lVar7;
        auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
        uVar6 = 0;
        auVar11 = auVar11 ^ _DAT_014d28c0;
        auVar12 = _DAT_014d28b0;
        do {
          auVar13 = auVar12 ^ auVar2;
          if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                      auVar11._4_4_ < auVar13._4_4_) & 1)) {
            piVar1[uVar6] = (int)uVar6;
          }
          if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
              auVar13._12_4_ <= auVar11._12_4_) {
            piVar1[uVar6 + 1] = (int)uVar6 + 1;
          }
          uVar6 = uVar6 + 2;
          lVar7 = auVar12._8_8_;
          auVar12._0_8_ = auVar12._0_8_ + 2;
          auVar12._8_8_ = lVar7 + 2;
        } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar6);
        if (0 < lVar9) {
          local_40 = 1;
          lVar7 = 0;
          local_48 = lVar9;
          do {
            lVar9 = 0;
            do {
              if (lVar9 == 0) {
                lVar8 = 0;
              }
              else {
                lVar10 = 0;
                lVar8 = 0;
                do {
                  iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                            _vptr_TPZSavable[0x21])(this,lVar9,lVar10);
                  iVar5 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                            _vptr_TPZSavable[0x21])(this,lVar10,lVar7);
                  lVar8 = lVar8 + CONCAT44(extraout_var_00,iVar5) * CONCAT44(extraout_var,iVar4);
                  lVar10 = lVar10 + 1;
                } while (lVar9 != lVar10);
              }
              iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                        _vptr_TPZSavable[0x21])(this,lVar9,lVar7);
              local_70 = CONCAT44(extraout_var_01,iVar4) - lVar8;
              (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                [0x23])(this,lVar9,lVar7,&local_70);
              lVar9 = lVar9 + 1;
            } while (lVar9 != local_40);
            iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x21])(this,lVar7,lVar7);
            lVar9 = lVar7 + 1;
            lVar8 = local_48;
            local_68 = lVar9;
            lVar10 = CONCAT44(extraout_var_02,iVar4);
            lVar3 = lVar7;
            if (lVar9 < local_48) {
              do {
                local_50 = lVar3;
                local_60 = lVar10;
                if (lVar7 == 0) {
                  lVar8 = 0;
                }
                else {
                  lVar10 = 0;
                  lVar8 = 0;
                  do {
                    iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                              _vptr_TPZSavable[0x21])(this,lVar9,lVar10);
                    iVar5 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                              _vptr_TPZSavable[0x21])(this,lVar10,lVar7);
                    lVar8 = lVar8 + CONCAT44(extraout_var_04,iVar5) *
                                    CONCAT44(extraout_var_03,iVar4);
                    lVar10 = lVar10 + 1;
                  } while (lVar7 != lVar10);
                }
                iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                          _vptr_TPZSavable[0x21])(this,lVar9,lVar7);
                local_70 = CONCAT44(extraout_var_05,iVar4) - lVar8;
                (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x23])(this,lVar9,lVar7,&local_70);
                iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                          _vptr_TPZSavable[0x21])(this,lVar9,lVar7);
                if ((double)((ulong)(double)local_60 & (ulong)DAT_014d2320) <
                    (double)((ulong)(double)CONCAT44(extraout_var_06,iVar4) & (ulong)DAT_014d2320))
                {
                  iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                            _vptr_TPZSavable[0x21])(this,lVar9,lVar7);
                  local_60 = CONCAT44(extraout_var_07,iVar4);
                  local_50 = lVar9;
                }
                lVar8 = local_48;
                lVar3 = local_50;
                lVar9 = lVar9 + 1;
                lVar10 = local_60;
              } while (lVar9 < local_48);
              if (lVar7 < local_50) {
                lVar9 = 0;
                do {
                  iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                            _vptr_TPZSavable[0x21])(this,lVar7,lVar9);
                  local_70 = CONCAT44(extraout_var_08,iVar4);
                  iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                            _vptr_TPZSavable[0x21])(this,lVar3,lVar9);
                  local_38 = CONCAT44(extraout_var_09,iVar4);
                  (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                    _vptr_TPZSavable[0x23])(this,lVar7,lVar9,&local_38);
                  (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                    _vptr_TPZSavable[0x23])(this,lVar3,lVar9,&local_70);
                  lVar9 = lVar9 + 1;
                } while (lVar8 != lVar9);
                piVar1 = local_58->fStore;
                iVar4 = piVar1[lVar7];
                piVar1[lVar7] = piVar1[lVar3];
                piVar1[lVar3] = iVar4;
              }
              lVar10 = local_60;
              for (lVar9 = local_68; lVar9 < lVar8; lVar9 = lVar9 + 1) {
                iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                          _vptr_TPZSavable[0x21])(this,lVar9,lVar7);
                auVar2._4_4_ = extraout_var_10;
                auVar2._0_4_ = iVar4;
                auVar2._8_8_ = (long)extraout_var_10 >> 0x1f;
                local_70 = SUB168(auVar2 / SEXT816(lVar10),0);
                (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x23])(this,lVar9,lVar7,&local_70);
              }
            }
            local_40 = local_40 + 1;
            lVar7 = local_68;
          } while (local_68 != lVar8);
        }
      }
      (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDecomposed = '\x02';
      iVar4 = 1;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_35638c,0x3d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int TPZFMatrix<TVar>::Decompose_LU(TPZVec<int> &index) {
    
    if (this->fDecomposed) return 0;
    
    if ( this->Rows() != this->Cols() ) {
        cout << "TPZFPivotMatrix::DecomposeLU ERRO : A Matriz não é quadrada" << endl;
        return 0;
    }
    
    int64_t i,j,k;
    TVar sum = 0.;
    int64_t nRows = this->Rows();
    int64_t nCols = this->Cols();
    
    index.Resize(nRows);
    //inicializo o vetor de índices para o caso de pivotamento
    for (i=0;i<nRows;i++) index[i] = i;
    
    //LU
    for (j=0;j<nCols;j++){
        // cout << "line..." << j << endl;
        for (i=0;i<=j;i++){
            sum = 0.;
            for (k=0;k<i;k++){
                sum += this->Get(i,k) * this->Get(k,j);
            }
            TVar aux = this->Get(i,j);
            PutVal(i,j,(aux - sum));
            //cout << "0_A[" << i << "," << j << "]= " << Get(i,j) << endl;
        }
        //Print(cout);
        TVar piv = this->Get(j,j);
        //  cout << "Pivo 1 =" << piv << endl;
        int64_t row = j;
        for (i=j+1;i<nRows;i++){
            sum = 0.;
            for (k=0;k<(j);k++){
                sum += this->Get(i,k) * this->Get(k,j);
            }
            TVar aux = this->Get(i,j);
            PutVal(i,j,(aux - sum));
            //cout << "1_A[" << i << "," << j << "]= " << Get(i,j) << endl;
            
            if (fabs(this->Get(i,j)) > fabs(piv)){
                piv = this->Get(i,j);
                //  cout << "Pivo 2 =" << piv << endl;
                row = i;
            }
        }
        //    Print(cout);
        if (row > j){
            for (k=0;k<nCols;k++){
                TVar aux = this->Get(j,k);
                PutVal(j,k,this->Get(row,k));
                //cout << "2_A[" << j << "," << k << "]= " << Get(j,k) << endl;
                PutVal(row,k,aux);
                //cout << "3_A[" << row << "," << k << "]= " << Get(row,k) << endl;
            }
            k = index[j];
            index[j] = index[row];
            index[row] = k;
        }
        //    cout << "Pivo = " << piv << endl;
        for (i=j+1;i<nRows;i++){
            if (fabs(piv) < fabs((TVar)1e-12)) {
                cout << "Pivot < 1e-12. Probably matrix is singular." << endl;
                DebugStop();
            }
            TVar aux = this->Get(i,j) / piv;
            PutVal(i,j,aux);
            //cout << "4_A[" << i << "," << j << "]= " << Get(i,j) << endl;
        }
        //Print(cout);
    }
    this->fDecomposed = ELUPivot;
    return 1;
}